

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O0

void __thiscall TextFile::writeCharacter(TextFile *this,wchar_t character)

{
  byte bVar1;
  byte bVar2;
  int local_1c;
  byte local_18;
  byte local_17;
  byte local_16;
  int length;
  uchar buffer [4];
  wchar_t character_local;
  TextFile *this_local;
  
  if (this->mode == Write) {
    local_1c = 0;
    bVar1 = (byte)character;
    if (character < L'\x80') {
      local_18 = bVar1 & 0x7f;
      local_1c = 1;
    }
    else if (this->encoding != ASCII) {
      bVar2 = (byte)(character >> 6);
      if (character < L'ࠀ') {
        local_18 = bVar2 & 0x1f | 0xc0;
        local_1c = 2;
        bVar2 = bVar1;
      }
      else {
        local_18 = (byte)(character >> 0xc) & 0xf | 0xe0;
        local_16 = bVar1 & 0x3f | 0x80;
        local_1c = 3;
      }
      local_17 = bVar2 & 0x3f | 0x80;
    }
    length = character;
    _buffer = this;
    fwrite(&local_18,1,(long)local_1c,(FILE *)this->handle);
  }
  return;
}

Assistant:

void TextFile::writeCharacter(wchar_t character)
{
	unsigned char buffer[4];
	if (mode != Write) return;

	// only support utf8 for now
	int length = 0;
	if (character < 0x80)
	{
#ifdef WIN32
		if (character == L'\n')
		{
			buffer[length++] = '\r';
		}
#endif
		buffer[length++] = character & 0x7F;
	} else if (encoding != ASCII)
	{
		if (character < 0x800)
		{
			buffer[0] = 0xC0 | ((character >> 6) & 0x1F);
			buffer[1] = 0x80 | (character & 0x3F);
			length = 2;
		} else {
			buffer[0] = 0xE0 | ((character >> 12) & 0xF);
			buffer[1] = 0x80 | ((character >> 6) & 0x3F);
			buffer[2] = 0x80 | (character & 0x3F);
			length = 3;
		}
	}

	fwrite(buffer,1,length,handle);
}